

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# zstd_compress.c
# Opt level: O1

ZSTD_CDict *
ZSTD_initStaticCDict
          (void *workspace,size_t workspaceSize,void *dict,size_t dictSize,
          ZSTD_dictLoadMethod_e dictLoadMethod,ZSTD_dictContentType_e dictContentType,
          ZSTD_compressionParameters cParams)

{
  void *__dest;
  uint uVar1;
  size_t code;
  ZSTD_CDict *pZVar2;
  long lVar3;
  ZSTD_CDict *pZVar4;
  long lVar5;
  void *pvVar6;
  
  pZVar4 = (ZSTD_CDict *)(1L << ((byte)cParams.chainLog & 0x3f));
  if (cParams.strategy == ZSTD_fast) {
    pZVar4 = (ZSTD_CDict *)0x0;
  }
  pZVar2 = (ZSTD_CDict *)0x0;
  if (((ulong)workspace & 7) == 0) {
    lVar5 = ((long)&pZVar4->dictBuffer + (1L << ((byte)cParams.hashLog & 0x3f))) * 4;
    lVar3 = dictSize + 0x2b04;
    if (dictLoadMethod == ZSTD_dlm_byRef) {
      lVar3 = 0x2b04;
    }
    if (workspaceSize < (ulong)(lVar3 + lVar5)) {
      pZVar2 = (ZSTD_CDict *)0x0;
    }
    else {
      __dest = (void *)((long)workspace + 0x1300);
      pvVar6 = __dest;
      if (dictLoadMethod == ZSTD_dlm_byCopy) {
        memcpy(__dest,dict,dictSize);
        pvVar6 = (void *)((long)__dest + dictSize);
        dict = __dest;
      }
      *(void **)((long)workspace + 0x18) = pvVar6;
      *(long *)((long)workspace + 0x20) = lVar5 + 0x1804;
      code = ZSTD_initCDict_internal
                       ((ZSTD_CDict *)workspace,dict,dictSize,ZSTD_dlm_byRef,dictContentType,cParams
                       );
      uVar1 = ZSTD_isError(code);
      pZVar2 = (ZSTD_CDict *)0x0;
      if (uVar1 == 0) {
        pZVar2 = (ZSTD_CDict *)workspace;
      }
    }
  }
  return pZVar2;
}

Assistant:

const ZSTD_CDict* ZSTD_initStaticCDict(
                                 void* workspace, size_t workspaceSize,
                           const void* dict, size_t dictSize,
                                 ZSTD_dictLoadMethod_e dictLoadMethod,
                                 ZSTD_dictContentType_e dictContentType,
                                 ZSTD_compressionParameters cParams)
{
    size_t const matchStateSize = ZSTD_sizeof_matchState(&cParams, /* forCCtx */ 0);
    size_t const neededSize = sizeof(ZSTD_CDict) + (dictLoadMethod == ZSTD_dlm_byRef ? 0 : dictSize)
                            + HUF_WORKSPACE_SIZE + matchStateSize;
    ZSTD_CDict* const cdict = (ZSTD_CDict*) workspace;
    void* ptr;
    if ((size_t)workspace & 7) return NULL;  /* 8-aligned */
    DEBUGLOG(4, "(workspaceSize < neededSize) : (%u < %u) => %u",
        (U32)workspaceSize, (U32)neededSize, (U32)(workspaceSize < neededSize));
    if (workspaceSize < neededSize) return NULL;

    if (dictLoadMethod == ZSTD_dlm_byCopy) {
        memcpy(cdict+1, dict, dictSize);
        dict = cdict+1;
        ptr = (char*)workspace + sizeof(ZSTD_CDict) + dictSize;
    } else {
        ptr = cdict+1;
    }
    cdict->workspace = ptr;
    cdict->workspaceSize = HUF_WORKSPACE_SIZE + matchStateSize;

    if (ZSTD_isError( ZSTD_initCDict_internal(cdict,
                                              dict, dictSize,
                                              ZSTD_dlm_byRef, dictContentType,
                                              cParams) ))
        return NULL;

    return cdict;
}